

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateDependencyManifestFile
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,GeneratorContextMap *output_directories,DiskSourceTree *source_tree)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  string *virtual_file;
  bool bVar2;
  int iVar3;
  pointer ppFVar4;
  _Hash_node_base *p_Var5;
  int *piVar6;
  ostream *poVar7;
  long lVar8;
  char *text;
  ulong uVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relative_output_filenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output_filenames;
  FileDescriptorSet file_set;
  FileOutputStream out;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  Printer printer;
  undefined1 local_1d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined8 local_1a8;
  DiskSourceTree *local_198;
  CommandLineInterface *local_190;
  _Hash_node_base *local_188;
  FileDescriptorSet local_180;
  undefined1 local_150 [80];
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_100;
  Printer local_d0;
  
  local_198 = source_tree;
  local_190 = this;
  FileDescriptorSet::FileDescriptorSet(&local_180);
  local_100._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_100._M_impl.super__Rb_tree_header._M_header;
  local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppFVar4 = (parsed_files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_100._M_impl.super__Rb_tree_header._M_header._M_right =
       local_100._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((parsed_files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar4) {
    uVar9 = 0;
    do {
      GetTransitiveDependencies
                (ppFVar4[uVar9],false,false,
                 (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)&local_100,&local_180.file_);
      uVar9 = uVar9 + 1;
      ppFVar4 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(parsed_files->
                                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3)
            );
  }
  local_1b8._M_allocated_capacity = 0;
  local_1b8._8_8_ = 0;
  local_1a8 = 0;
  p_Var5 = (output_directories->_M_h)._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      local_1d8._0_8_ = (pointer)0x0;
      local_1d8._8_8_ = (pointer)0x0;
      local_1d8._16_8_ = (pointer)0x0;
      local_188 = p_Var5;
      GeneratorContextImpl::GetOutputFilenames
                ((GeneratorContextImpl *)p_Var5[5]._M_nxt,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1d8);
      if (local_1d8._8_8_ != local_1d8._0_8_) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_188 + 1)
        ;
        lVar8 = 0;
        uVar9 = 0;
        do {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d0,__lhs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_1d8._0_8_ + lVar8));
          iVar3 = std::__cxx11::string::compare((ulong)&local_d0,0,(char *)0x2);
          if (iVar3 == 0) {
            std::__cxx11::string::substr((ulong)local_150,(ulong)&local_d0);
            std::__cxx11::string::operator=((string *)&local_d0,(string *)local_150);
            if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
              operator_delete((void *)local_150._0_8_);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1b8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0
                     );
          if (local_d0._0_8_ != (long)&local_d0 + 0x10U) {
            operator_delete((void *)local_d0._0_8_);
          }
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar9 < (ulong)((long)(local_1d8._8_8_ - local_1d8._0_8_) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
      p_Var5 = local_188->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  while (iVar3 = open((local_190->dependency_out_name_)._M_dataplus._M_p,0x241,0x1b6), iVar3 < 0) {
    piVar6 = __errno_location();
    if (*piVar6 != 4) {
      perror((local_190->dependency_out_name_)._M_dataplus._M_p);
      bVar2 = false;
LAB_002294ad:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1b8);
      std::
      _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::~_Rb_tree(&local_100);
      FileDescriptorSet::~FileDescriptorSet(&local_180);
      return bVar2;
    }
  }
  io::FileOutputStream::FileOutputStream((FileOutputStream *)local_150,iVar3,-1);
  io::Printer::Printer(&local_d0,(ZeroCopyOutputStream *)local_150,'$');
  if (local_1b8._8_8_ != local_1b8._M_allocated_capacity) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      io::Printer::Print<>(&local_d0,*(char **)(local_1b8._M_allocated_capacity + lVar8));
      text = " \\\n";
      if (uVar9 == ((long)(local_1b8._8_8_ - local_1b8._0_8_) >> 5) - 1U) {
        text = ":";
      }
      io::Printer::Print<>(&local_d0,text);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar9 < (ulong)((long)(local_1b8._8_8_ - local_1b8._0_8_) >> 5));
  }
  bVar2 = true;
  if (0 < local_180.file_.super_RepeatedPtrFieldBase.current_size_) {
    pbVar1 = (pointer)(local_1d8 + 0x10);
    lVar8 = 0;
    do {
      virtual_file = *(string **)
                      ((long)(local_180.file_.super_RepeatedPtrFieldBase.rep_)->elements[lVar8] +
                      0xb0);
      local_1d8._8_8_ = (pointer)0x0;
      local_1d8._16_8_ = local_1d8._16_8_ & 0xffffffffffffff00;
      local_1d8._0_8_ = pbVar1;
      if ((local_198 == (DiskSourceTree *)0x0) ||
         (bVar2 = DiskSourceTree::VirtualFileToDiskFile(local_198,virtual_file,(string *)local_1d8),
         !bVar2)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unable to identify path for file ",0x21);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(virtual_file->_M_dataplus)._M_p,
                            virtual_file->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((pointer)local_1d8._0_8_ != pbVar1) {
          operator_delete((void *)local_1d8._0_8_);
        }
        bVar2 = false;
        goto LAB_00229493;
      }
      io::Printer::Print<char[10],std::__cxx11::string>
                (&local_d0," $disk_file$",(char (*) [10])"disk_file",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
      if (lVar8 < (long)local_180.file_.super_RepeatedPtrFieldBase.current_size_ + -1) {
        io::Printer::Print<>(&local_d0,"\\\n");
      }
      if ((pointer)local_1d8._0_8_ != pbVar1) {
        operator_delete((void *)local_1d8._0_8_);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_180.file_.super_RepeatedPtrFieldBase.current_size_);
    bVar2 = true;
  }
LAB_00229493:
  io::Printer::~Printer(&local_d0);
  io::FileOutputStream::~FileOutputStream((FileOutputStream *)local_150);
  goto LAB_002294ad;
}

Assistant:

bool CommandLineInterface::GenerateDependencyManifestFile(
    const std::vector<const FileDescriptor*>& parsed_files,
    const GeneratorContextMap& output_directories,
    DiskSourceTree* source_tree) {
  FileDescriptorSet file_set;

  std::set<const FileDescriptor*> already_seen;
  for (int i = 0; i < parsed_files.size(); i++) {
    GetTransitiveDependencies(parsed_files[i], false, false, &already_seen,
                              file_set.mutable_file());
  }

  std::vector<std::string> output_filenames;
  for (const auto& pair : output_directories) {
    const std::string& location = pair.first;
    GeneratorContextImpl* directory = pair.second.get();
    std::vector<std::string> relative_output_filenames;
    directory->GetOutputFilenames(&relative_output_filenames);
    for (int i = 0; i < relative_output_filenames.size(); i++) {
      std::string output_filename = location + relative_output_filenames[i];
      if (output_filename.compare(0, 2, "./") == 0) {
        output_filename = output_filename.substr(2);
      }
      output_filenames.push_back(output_filename);
    }
  }

  int fd;
  do {
    fd = open(dependency_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(dependency_out_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  io::Printer printer(&out, '$');

  for (int i = 0; i < output_filenames.size(); i++) {
    printer.Print(output_filenames[i].c_str());
    if (i == output_filenames.size() - 1) {
      printer.Print(":");
    } else {
      printer.Print(" \\\n");
    }
  }

  for (int i = 0; i < file_set.file_size(); i++) {
    const FileDescriptorProto& file = file_set.file(i);
    const std::string& virtual_file = file.name();
    std::string disk_file;
    if (source_tree &&
        source_tree->VirtualFileToDiskFile(virtual_file, &disk_file)) {
      printer.Print(" $disk_file$", "disk_file", disk_file);
      if (i < file_set.file_size() - 1) printer.Print("\\\n");
    } else {
      std::cerr << "Unable to identify path for file " << virtual_file
                << std::endl;
      return false;
    }
  }

  return true;
}